

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

bool __thiscall
glcts::TextureCubeMapArraySamplingTest::verifyResult
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          resolutionDefinition *resolution,samplingFunction sampling_function,uchar *data)

{
  bool bVar1;
  undefined1 auStack_68 [8];
  componentProvider component_provider;
  uchar *data_local;
  samplingFunction sampling_function_local;
  resolutionDefinition *resolution_local;
  formatDefinition *format_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  component_provider.getColorIntComponents =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLint_ptr *)0x0;
  component_provider.getDepthComponents =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)0x0;
  component_provider.getColorUByteComponents =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)0x0;
  component_provider.getColorUintComponents =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)0x0;
  auStack_68 = (undefined1  [8])0x0;
  component_provider.getColorFloatComponents =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)0x0;
  component_provider.getStencilComponents =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)0x0;
  if (sampling_function != Texture) {
    if (sampling_function - TextureLod < 2) {
      auStack_68 = (undefined1  [8])getExpectedColorFloatComponentsForTextureLod;
      component_provider.getColorFloatComponents =
           getExpectedColorIntComponentsForTextureLod<unsigned_char>;
      component_provider.getColorUByteComponents =
           getExpectedColorIntComponentsForTextureLod<unsigned_int>;
      component_provider.getColorUintComponents = getExpectedColorIntComponentsForTextureLod<int>;
      component_provider.getColorIntComponents = getExpectedDepthComponentsForTextureLod;
      component_provider.getDepthComponents = getExpectedStencilComponentsForTextureLod;
      component_provider.getStencilComponents = getExpectedCompressedComponentsForTextureLod;
      goto LAB_0166807c;
    }
    if (sampling_function != TextureGather) goto LAB_0166807c;
  }
  auStack_68 = (undefined1  [8])getExpectedColorFloatComponentsForTexture;
  component_provider.getColorFloatComponents =
       getExpectedColorIntComponentsForTexture<unsigned_char>;
  component_provider.getColorUByteComponents = getExpectedColorIntComponentsForTexture<unsigned_int>
  ;
  component_provider.getColorUintComponents = getExpectedColorIntComponentsForTexture<int>;
  component_provider.getColorIntComponents = getExpectedDepthComponentsForTexture;
  component_provider.getDepthComponents = getExpectedStencilComponentsForTexture;
  component_provider.getStencilComponents = getExpectedCompressedComponentsForTexture;
LAB_0166807c:
  component_provider.getCompressedComponents =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)data;
  bVar1 = verifyResultHelper(this,format,resolution,(componentProvider *)auStack_68,data);
  return bVar1;
}

Assistant:

bool TextureCubeMapArraySamplingTest::verifyResult(const formatDefinition&	 format,
												   const resolutionDefinition& resolution,
												   const samplingFunction sampling_function, unsigned char* data)
{
	componentProvider component_provider = { NULL, NULL, NULL, NULL, NULL, NULL, NULL };

	switch (sampling_function)
	{
	case Texture:
	case TextureGather:
		component_provider.getColorFloatComponents = getExpectedColorFloatComponentsForTexture;
		component_provider.getColorUByteComponents = getExpectedColorIntComponentsForTexture<glw::GLubyte>;
		component_provider.getColorUintComponents  = getExpectedColorIntComponentsForTexture<glw::GLuint>;
		component_provider.getColorIntComponents   = getExpectedColorIntComponentsForTexture<glw::GLint>;
		component_provider.getDepthComponents	  = getExpectedDepthComponentsForTexture;
		component_provider.getStencilComponents	= getExpectedStencilComponentsForTexture;
		component_provider.getCompressedComponents = getExpectedCompressedComponentsForTexture;
		break;
	case TextureLod:
	case TextureGrad:
		component_provider.getColorFloatComponents = getExpectedColorFloatComponentsForTextureLod;
		component_provider.getColorUByteComponents = getExpectedColorIntComponentsForTextureLod<glw::GLubyte>;
		component_provider.getColorUintComponents  = getExpectedColorIntComponentsForTextureLod<glw::GLuint>;
		component_provider.getColorIntComponents   = getExpectedColorIntComponentsForTextureLod<glw::GLint>;
		component_provider.getDepthComponents	  = getExpectedDepthComponentsForTextureLod;
		component_provider.getStencilComponents	= getExpectedStencilComponentsForTextureLod;
		component_provider.getCompressedComponents = getExpectedCompressedComponentsForTextureLod;
		break;
	}

	return verifyResultHelper(format, resolution, component_provider, data);
}